

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtBase.h
# Opt level: O1

void __thiscall axl::io::ShmtBase::~ShmtBase(ShmtBase *this)

{
  sem_t *psVar1;
  int in_ESI;
  
  close(this,in_ESI);
  psVar1 = (sem_t *)(this->m_writeSemaphore).m_sem.
                    super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>.m_h
  ;
  if (psVar1 != (sem_t *)0x0) {
    sem_close(psVar1);
    (this->m_writeSemaphore).m_sem.
    super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>.m_h = (sem_t *)0x0;
  }
  psVar1 = (sem_t *)(this->m_readSemaphore).m_sem.
                    super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>.m_h
  ;
  if (psVar1 != (sem_t *)0x0) {
    sem_close(psVar1);
    (this->m_readSemaphore).m_sem.
    super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>.m_h = (sem_t *)0x0;
  }
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
            (&(this->m_mapping).m_sharedMemoryName.
              super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)
             &(this->m_mapping).m_sharedMemory);
  psx::Mapping::~Mapping(&(this->m_mapping).m_mapping);
  sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&this->m_file);
  return;
}

Assistant:

~ShmtBase() {
		close();
	}